

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

LogDestination * google::LogDestination::log_destination(LogSeverity severity)

{
  LogDestination *this;
  
  if ((uint)severity < 4) {
    this = (LogDestination *)(&log_destinations_)[(uint)severity];
    if (this == (LogDestination *)0x0) {
      this = (LogDestination *)operator_new(0xe8);
      LogDestination(this,severity,(char *)0x0);
      (&log_destinations_)[(uint)severity] = this;
    }
    return this;
  }
  __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                ,0x378,"static LogDestination *google::LogDestination::log_destination(LogSeverity)"
               );
}

Assistant:

inline LogDestination* LogDestination::log_destination(LogSeverity severity) {
  assert(severity >=0 && severity < NUM_SEVERITIES);
  if (!log_destinations_[severity]) {
    log_destinations_[severity] = new LogDestination(severity, NULL);
  }
  return log_destinations_[severity];
}